

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

int pbrt::rply_face_callback(p_ply_argument argument)

{
  int *piVar1;
  long lVar2;
  iterator iVar3;
  double dVar4;
  FaceCallbackContext *context;
  int vb;
  long value_index;
  long va;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  long length;
  long flags;
  
  ply_get_argument_user_data(argument,&context,&flags);
  ply_get_argument_property(argument,(p_ply_property *)0x0,&length,&value_index);
  if (length - 5U < 0xfffffffffffffffe) {
    local_38 = 0;
    vb = (int)length;
    local_30._M_local_buf[0] = '\0';
    va = (long)&local_30;
    detail::stringPrintfRecursive<int>
              ((string *)&va,
               "plymesh: Ignoring face with %i vertices (only triangles and quads are supported!)",
               &vb);
    Warning((FileLoc *)0x0,(char *)va);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)va != &local_30) {
      operator_delete((void *)va,
                      CONCAT71(local_30._M_allocated_capacity._1_7_,local_30._M_local_buf[0]) + 1);
    }
  }
  else if (-1 < value_index) {
    dVar4 = ply_get_argument_value(argument);
    context->face[value_index] = (int)dVar4;
    if (value_index == length + -1) {
      if (length == 3) {
        lVar2 = 0;
        do {
          iVar3._M_current =
               (context->triIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar1 = (int *)((long)context->face + lVar2);
          if (iVar3._M_current ==
              (context->triIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&context->triIndices,iVar3,piVar1);
          }
          else {
            *iVar3._M_current = *piVar1;
            (context->triIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar2 = lVar2 + 4;
        } while (lVar2 != 0xc);
      }
      else {
        va = length;
        vb = 4;
        if (length != 4) {
          LogFatal<char_const(&)[7],char_const(&)[2],char_const(&)[7],long&,char_const(&)[2],int&>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                     ,0x114,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [7])0x513350,
                     (char (*) [2])0x5131f0,(char (*) [7])0x513350,&va,(char (*) [2])0x5131f0,&vb);
        }
        iVar3._M_current =
             (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar3._M_current == piVar1) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&context->quadIndices,iVar3,context->face);
          iVar3._M_current =
               (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar1 = (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar3._M_current = context->face[0];
          iVar3._M_current = iVar3._M_current + 1;
          (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current;
        }
        if (iVar3._M_current == piVar1) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&context->quadIndices,iVar3,
                     context->face + 1);
          iVar3._M_current =
               (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar1 = (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar3._M_current = context->face[1];
          iVar3._M_current = iVar3._M_current + 1;
          (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current;
        }
        if (iVar3._M_current == piVar1) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&context->quadIndices,iVar3,
                     context->face + 3);
          iVar3._M_current =
               (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          piVar1 = (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar3._M_current = context->face[3];
          iVar3._M_current = iVar3._M_current + 1;
          (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current;
        }
        if (iVar3._M_current == piVar1) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&context->quadIndices,iVar3,
                     context->face + 2);
        }
        else {
          *iVar3._M_current = context->face[2];
          (context->quadIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
    }
  }
  return 1;
}

Assistant:

int rply_face_callback(p_ply_argument argument) {
    FaceCallbackContext *context;
    long flags;
    ply_get_argument_user_data(argument, (void **)&context, &flags);

    long length, value_index;
    ply_get_argument_property(argument, nullptr, &length, &value_index);

    if (length != 3 && length != 4) {
        Warning("plymesh: Ignoring face with %i vertices (only triangles and quads "
                "are supported!)",
                (int)length);
        return 1;
    } else if (value_index < 0) {
        return 1;
    }

    if (value_index >= 0)
        context->face[value_index] = (int)ply_get_argument_value(argument);

    if (value_index == length - 1) {
        if (length == 3)
            for (int i = 0; i < 3; ++i)
                context->triIndices.push_back(context->face[i]);
        else {
            CHECK_EQ(length, 4);

            // Note: modify order since we're specifying it as a blp...
            context->quadIndices.push_back(context->face[0]);
            context->quadIndices.push_back(context->face[1]);
            context->quadIndices.push_back(context->face[3]);
            context->quadIndices.push_back(context->face[2]);
        }
    }

    return 1;
}